

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merge_return_pass.cpp
# Opt level: O1

bool __thiscall
spvtools::opt::MergeReturnPass::PredicateBlocks
          (MergeReturnPass *this,BasicBlock *return_block,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *predicated,
          list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *order)

{
  pointer pSVar1;
  Instruction *pIVar2;
  Instruction *this_00;
  bool bVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  size_type sVar6;
  bool bVar7;
  pointer pSVar8;
  __hashtable *__h;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar9;
  BasicBlock *block;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  seen;
  BasicBlock *local_88;
  list<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_> *local_80;
  BasicBlock *local_78;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *local_70;
  _Any_data local_68;
  code *local_58;
  code *pcStack_50;
  undefined4 local_48;
  undefined8 local_40;
  __node_base_ptr p_Stack_38;
  
  local_78 = return_block;
  sVar6 = std::
          _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
          ::count(&predicated->_M_h,&local_78);
  bVar7 = true;
  if (sVar6 == 0) {
    local_88 = (BasicBlock *)0x0;
    pcStack_50 = std::
                 _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:397:38)>
                 ::_M_invoke;
    local_58 = std::
               _Function_handler<void_(unsigned_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp:397:38)>
               ::_M_manager;
    local_68._M_unused._M_object = this;
    local_68._8_8_ = &local_88;
    BasicBlock::ForEachSuccessorLabel(local_78,(function<void_(unsigned_int)> *)&local_68);
    if (local_58 != (code *)0x0) {
      (*local_58)(&local_68,&local_68,3);
    }
    if (local_88 == (BasicBlock *)0x0) {
      __assert_fail("block && \"Return blocks should have returns already replaced by a single \" \"unconditional branch.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                    ,0x194,
                    "bool spvtools::opt::MergeReturnPass::PredicateBlocks(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *)"
                   );
    }
    pSVar1 = (this->state_).
             super__Vector_base<spvtools::opt::MergeReturnPass::StructuredControlState,_std::allocator<spvtools::opt::MergeReturnPass::StructuredControlState>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    local_68._M_unused._M_object = &p_Stack_38;
    local_68._8_8_ = 1;
    local_58 = (code *)0x0;
    pcStack_50 = (code *)0x0;
    local_48 = 0x3f800000;
    local_40 = 0;
    p_Stack_38 = (__node_base_ptr)0x0;
    pIVar2 = (local_88->label_)._M_t.
             super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             ._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
    uVar5 = 0;
    uVar4 = 0;
    if (pIVar2->has_result_id_ == true) {
      uVar4 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
    }
    pIVar2 = pSVar1[-1].current_merge_;
    local_80 = order;
    if (pIVar2 != (Instruction *)0x0) {
      uVar5 = (pIVar2->has_result_id_ & 1) + 1;
      if (pIVar2->has_type_id_ == false) {
        uVar5 = (uint)pIVar2->has_result_id_;
      }
      uVar5 = Instruction::GetSingleWordOperand(pIVar2,uVar5);
    }
    pSVar8 = pSVar1 + -1;
    if (uVar4 != uVar5) {
      pIVar2 = (local_88->label_)._M_t.
               super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
               ._M_t.
               super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
               .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
      uVar5 = 0;
      uVar4 = 0;
      if (pIVar2->has_result_id_ == true) {
        uVar4 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
      }
      pIVar2 = pSVar1[-1].break_merge_;
      if (pIVar2 != (Instruction *)0x0) {
        uVar5 = (pIVar2->has_result_id_ & 1) + 1;
        if (pIVar2->has_type_id_ == false) {
          uVar5 = (uint)pIVar2->has_result_id_;
        }
        uVar5 = Instruction::GetSingleWordOperand(pIVar2,uVar5);
      }
      pSVar8 = pSVar1;
      if (uVar4 == uVar5) {
        pSVar8 = pSVar1 + 1;
        do {
          pIVar2 = pSVar8[-2].break_merge_;
          uVar5 = 0;
          uVar4 = 0;
          if (pIVar2 != (Instruction *)0x0) {
            uVar4 = (pIVar2->has_result_id_ & 1) + 1;
            if (pIVar2->has_type_id_ == false) {
              uVar4 = (uint)pIVar2->has_result_id_;
            }
            uVar4 = Instruction::GetSingleWordOperand(pIVar2,uVar4);
          }
          pIVar2 = (local_88->label_)._M_t.
                   super___uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                   .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl;
          if (pIVar2->has_result_id_ == true) {
            uVar5 = Instruction::GetSingleWordOperand(pIVar2,(uint)pIVar2->has_type_id_);
          }
          pSVar8 = pSVar8 + -1;
        } while (uVar4 == uVar5);
      }
    }
    bVar7 = true;
    while( true ) {
      if (((local_88 == (BasicBlock *)0x0) || (local_88 == this->final_return_block_)) ||
         (local_70 = predicated,
         pVar9 = std::
                 _Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                 ::
                 _M_insert<spvtools::opt::BasicBlock*const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<spvtools::opt::BasicBlock*,false>>>>
                           ((_Hashtable<spvtools::opt::BasicBlock*,spvtools::opt::BasicBlock*,std::allocator<spvtools::opt::BasicBlock*>,std::__detail::_Identity,std::equal_to<spvtools::opt::BasicBlock*>,std::hash<spvtools::opt::BasicBlock*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                             *)predicated,&local_88,&local_70),
         ((undefined1  [16])pVar9 & (undefined1  [16])0x1) == (undefined1  [16])0x0))
      goto LAB_00260e99;
      pIVar2 = pSVar8[-1].break_merge_;
      if (pIVar2 == (Instruction *)0x0) {
        __assert_fail("state->InBreakable() && \"Should be in the placeholder construct at the very least.\""
                      ,
                      "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/merge_return_pass.cpp"
                      ,0x1a4,
                      "bool spvtools::opt::MergeReturnPass::PredicateBlocks(BasicBlock *, std::unordered_set<BasicBlock *> *, std::list<BasicBlock *> *)"
                     );
      }
      uVar4 = (pIVar2->has_result_id_ & 1) + 1;
      if (pIVar2->has_type_id_ == false) {
        uVar4 = (uint)pIVar2->has_result_id_;
      }
      uVar4 = Instruction::GetSingleWordOperand(pIVar2,uVar4);
      pSVar8 = pSVar8 + 1;
      do {
        this_00 = pSVar8[-2].break_merge_;
        if (this_00 == (Instruction *)0x0) {
          uVar5 = 0;
        }
        else {
          uVar5 = (this_00->has_result_id_ & 1) + 1;
          if (this_00->has_type_id_ == false) {
            uVar5 = (uint)this_00->has_result_id_;
          }
          uVar5 = Instruction::GetSingleWordOperand(this_00,uVar5);
        }
        pSVar8 = pSVar8 + -1;
      } while (uVar5 == uVar4);
      bVar3 = BreakFromConstruct(this,local_88,predicated,local_80,pIVar2);
      if (!bVar3) break;
      local_88 = IRContext::get_instr_block((this->super_MemPass).super_Pass.context_,uVar4);
    }
    bVar7 = false;
LAB_00260e99:
    std::
    _Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
    ::~_Hashtable((_Hashtable<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>,_std::__detail::_Identity,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::hash<spvtools::opt::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
                   *)&local_68);
  }
  return bVar7;
}

Assistant:

bool MergeReturnPass::PredicateBlocks(
    BasicBlock* return_block, std::unordered_set<BasicBlock*>* predicated,
    std::list<BasicBlock*>* order) {
  // The CFG is being modified as the function proceeds so avoid caching
  // successors.

  if (predicated->count(return_block)) {
    return true;
  }

  BasicBlock* block = nullptr;
  const BasicBlock* const_block = const_cast<const BasicBlock*>(return_block);
  const_block->ForEachSuccessorLabel([this, &block](const uint32_t idx) {
    BasicBlock* succ_block = context()->get_instr_block(idx);
    assert(block == nullptr);
    block = succ_block;
  });
  assert(block &&
         "Return blocks should have returns already replaced by a single "
         "unconditional branch.");

  auto state = state_.rbegin();
  std::unordered_set<BasicBlock*> seen;
  if (block->id() == state->CurrentMergeId()) {
    state++;
  } else if (block->id() == state->BreakMergeId()) {
    while (state->BreakMergeId() == block->id()) {
      state++;
    }
  }

  while (block != nullptr && block != final_return_block_) {
    if (!predicated->insert(block).second) break;
    // Skip structured subgraphs.
    assert(state->InBreakable() &&
           "Should be in the placeholder construct at the very least.");
    Instruction* break_merge_inst = state->BreakMergeInst();
    uint32_t merge_block_id = break_merge_inst->GetSingleWordInOperand(0);
    while (state->BreakMergeId() == merge_block_id) {
      state++;
    }
    if (!BreakFromConstruct(block, predicated, order, break_merge_inst)) {
      return false;
    }
    block = context()->get_instr_block(merge_block_id);
  }
  return true;
}